

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_g_Module.cpp
# Opt level: O0

bool __thiscall axl::g::Module::addFinalizer(Module *this,Ptr<axl::g::Finalizer> *finalizer)

{
  Ptr<axl::g::Finalizer> *in_RDI;
  FinalizerEntry *finalizerEntry;
  Ptr<axl::g::Finalizer> *in_stack_ffffffffffffffb8;
  FinalizerEntry *in_stack_ffffffffffffffd0;
  ListBase<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>_>
  *in_stack_ffffffffffffffd8;
  
  operator_new(0x20);
  FinalizerEntry::FinalizerEntry((FinalizerEntry *)0x17ae62);
  rc::Ptr<axl::g::Finalizer>::operator=(in_RDI,in_stack_ffffffffffffffb8);
  sys::Lock::lock((Lock *)0x17ae8f);
  sl::
  ListBase<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>_>
  ::insertTail(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  sys::Lock::unlock((Lock *)0x17aeb5);
  return true;
}

Assistant:

bool
Module::addFinalizer(const rc::Ptr<Finalizer>& finalizer) {
	FinalizerEntry* finalizerEntry = new FinalizerEntry;
	finalizerEntry->m_finalizer = finalizer;

	m_finalizerListLock.lock();
	m_finalizerList.insertTail(finalizerEntry);
	m_finalizerListLock.unlock();
	return true;
}